

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::MacroExpansion::append
          (MacroExpansion *this,Token token,SourceLocation location,bool allowLineContinuation)

{
  BumpAllocator *pBVar1;
  SmallVectorBase<slang::parsing::Token> *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  TokenKind TVar4;
  Token *args;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar5;
  basic_string_view<char,_std::char_traits<char>_> rawText;
  Token local_f8;
  Token local_e8;
  undefined8 local_d8;
  char *pcStack_d0;
  string_view local_c8;
  SmallVector<slang::parsing::Trivia,_8UL> newTrivia;
  
  TVar4 = token.kind;
  local_f8 = token;
  if (this->any == false) {
    pBVar1 = this->alloc;
    if (this->isTopLevel == false) {
      sVar5 = Token::trivia(&this->usageSite);
    }
    else {
      sVar5 = (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0);
    }
    local_f8 = Token::withTrivia(&local_f8,pBVar1,sVar5);
    TVar4 = local_f8.kind;
    this->any = true;
  }
  if (TVar4 == LineContinuation && !allowLineContinuation) {
    newTrivia.super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
    newTrivia.super_SmallVectorBase<slang::parsing::Trivia>.data_ =
         (pointer)newTrivia.super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
    newTrivia.super_SmallVectorBase<slang::parsing::Trivia>.cap = 8;
    local_e8 = (Token)Token::trivia(&local_f8);
    SmallVectorBase<slang::parsing::Trivia>::
    append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
              (&newTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
               (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&local_e8);
    local_c8 = Token::rawText(&local_f8);
    rawText = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_c8,1,0xffffffffffffffff);
    Trivia::Trivia((Trivia *)&local_e8,EndOfLine,rawText);
    SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
              (&newTrivia.super_SmallVectorBase<slang::parsing::Trivia>,(Trivia *)&local_e8);
    pSVar2 = this->dest;
    pBVar1 = this->alloc;
    iVar3 = SmallVectorBase<slang::parsing::Trivia>::copy
                      (&newTrivia.super_SmallVectorBase<slang::parsing::Trivia>,
                       (EVP_PKEY_CTX *)pBVar1,src);
    sVar5._M_ptr._4_4_ = extraout_var;
    sVar5._M_ptr._0_4_ = iVar3;
    local_d8 = 0;
    pcStack_d0 = "";
    sVar5._M_extent._M_extent_value = extraout_RDX._M_extent_value;
    Token::Token(&local_e8,pBVar1,EmptyMacroArgument,sVar5,(string_view)(ZEXT816(0x4b214a) << 0x40),
                 location);
    args = &local_e8;
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>(pSVar2,args);
    SmallVectorBase<slang::parsing::Trivia>::cleanup
              (&newTrivia.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)args);
  }
  else {
    pSVar2 = this->dest;
    newTrivia.super_SmallVectorBase<slang::parsing::Trivia>._0_16_ =
         Token::withLocation(&local_f8,this->alloc,location);
    SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
              (pSVar2,(Token *)&newTrivia);
  }
  return;
}

Assistant:

void Preprocessor::MacroExpansion::append(Token token, SourceLocation location,
                                          bool allowLineContinuation) {
    if (!any) {
        if (!isTopLevel)
            token = token.withTrivia(alloc, usageSite.trivia());
        else
            token = token.withTrivia(alloc, {});
        any = true;
    }

    // Line continuations get stripped out when we expand macros and become newline trivia instead.
    if (token.kind == TokenKind::LineContinuation && !allowLineContinuation) {
        SmallVector<Trivia, 8> newTrivia;
        newTrivia.append_range(token.trivia());
        newTrivia.push_back(Trivia(TriviaKind::EndOfLine, token.rawText().substr(1)));

        dest.push_back(
            Token(alloc, TokenKind::EmptyMacroArgument, newTrivia.copy(alloc), "", location));
    }
    else {
        dest.push_back(token.withLocation(alloc, location));
    }
}